

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O2

void dist_single_run<double,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>,std::uniform_real_distribution<double>>
               (uniform_real_distribution<double> *dist,
               linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *generator,
               size_t times)

{
  ostream *poVar1;
  bool bVar2;
  result_type_conflict1 rVar3;
  double dVar4;
  
  dVar4 = 0.0;
  while (bVar2 = times != 0, times = times - 1, bVar2) {
    rVar3 = std::uniform_real_distribution<double>::operator()(dist,generator);
    dVar4 = dVar4 + rVar3;
  }
  if (dVar4 == 0.0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"This is to avoid compiler optimizations.");
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  return;
}

Assistant:

void dist_single_run (D& dist, G& generator, size_t times ) {
    Real total = 0.0;

    for ( size_t i = 0; i < times; ++i )
        total += dist(generator);

    if ( total == 0 ) cout << "This is to avoid compiler optimizations." << endl;
}